

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_midside_stereo(float *left,int n)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  float b;
  float a;
  drmp3_f4 vr;
  drmp3_f4 vl;
  float *right;
  int i;
  int n_local;
  float *left_local;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  right._0_4_ = 0;
  iVar7 = drmp3_have_simd();
  if (iVar7 != 0) {
    for (; (int)right < n + -3; right._0_4_ = (int)right + 4) {
      uVar3 = *(undefined8 *)(left + (int)right);
      uVar4 = *(undefined8 *)(left + (int)right + 2);
      uVar5 = *(undefined8 *)(left + (long)(int)right + 0x240);
      uVar6 = *(undefined8 *)(left + (long)(int)right + 0x240 + 2);
      local_38 = (float)uVar3;
      fStack_34 = (float)((ulong)uVar3 >> 0x20);
      fStack_30 = (float)uVar4;
      fStack_2c = (float)((ulong)uVar4 >> 0x20);
      local_48 = (float)uVar5;
      fStack_44 = (float)((ulong)uVar5 >> 0x20);
      fStack_40 = (float)uVar6;
      fStack_3c = (float)((ulong)uVar6 >> 0x20);
      *(ulong *)(left + (int)right) = CONCAT44(fStack_34 + fStack_44,local_38 + local_48);
      *(ulong *)(left + (int)right + 2) = CONCAT44(fStack_2c + fStack_3c,fStack_30 + fStack_40);
      *(ulong *)(left + (long)(int)right + 0x240) =
           CONCAT44(fStack_34 - fStack_44,local_38 - local_48);
      *(ulong *)(left + (long)(int)right + 0x240 + 2) =
           CONCAT44(fStack_2c - fStack_3c,fStack_30 - fStack_40);
    }
  }
  for (; (int)right < n; right._0_4_ = (int)right + 1) {
    fVar1 = left[(int)right];
    fVar2 = left[(long)(int)right + 0x240];
    left[(int)right] = fVar1 + fVar2;
    left[(long)(int)right + 0x240] = fVar1 - fVar2;
  }
  return;
}

Assistant:

static void drmp3_L3_midside_stereo(float *left, int n)
{
    int i = 0;
    float *right = left + 576;
#if DRMP3_HAVE_SIMD
    if (drmp3_have_simd())
    {
        for (; i < n - 3; i += 4)
        {
            drmp3_f4 vl = DRMP3_VLD(left + i);
            drmp3_f4 vr = DRMP3_VLD(right + i);
            DRMP3_VSTORE(left + i, DRMP3_VADD(vl, vr));
            DRMP3_VSTORE(right + i, DRMP3_VSUB(vl, vr));
        }
#ifdef __GNUC__
        /* Workaround for spurious -Waggressive-loop-optimizations warning from gcc.
         * For more info see: https://github.com/lieff/minimp3/issues/88
         */
        if (__builtin_constant_p(n % 4 == 0) && n % 4 == 0)
            return;
#endif
    }
#endif
    for (; i < n; i++)
    {
        float a = left[i];
        float b = right[i];
        left[i] = a + b;
        right[i] = a - b;
    }
}